

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::evalTexture3DProjLodOffset(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float lod;
  Vector<int,_3> local_5c;
  undefined1 local_50 [32];
  tcu local_30 [8];
  float afStack_28 [2];
  
  fVar1 = c->in[0].m_data[3];
  fVar2 = c->in[0].m_data[0];
  fVar3 = c->in[0].m_data[1];
  fVar4 = c->in[0].m_data[2];
  lod = c->in[1].m_data[0];
  tcu::Vector<int,_3>::Vector(&local_5c,&p->offset);
  texture3DOffset((ShaderEvalContext *)local_50,fVar2 / fVar1,fVar3 / fVar1,fVar4 / fVar1,lod,
                  (IVec3 *)c);
  tcu::operator*((tcu *)(local_50 + 0x10),(Vector<float,_4> *)local_50,&p->scale);
  tcu::operator+(local_30,(Vector<float,_4> *)(local_50 + 0x10),&p->bias);
  *(tcu (*) [8])(c->color).m_data = local_30;
  *(float (*) [2])((c->color).m_data + 2) = afStack_28;
  return;
}

Assistant:

static void		evalTexture3DProjLodOffset		(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture3DOffset(c, c.in[0].x()/c.in[0].w(), c.in[0].y()/c.in[0].w(), c.in[0].z()/c.in[0].w(), c.in[1].x(), p.offset)*p.scale + p.bias; }